

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O2

void __thiscall
booster::aio::basic_socket::set_option
          (basic_socket *this,boolean_option_type opt,bool v,error_code *e)

{
  int __optname;
  int __fd;
  int iVar1;
  undefined7 in_register_00000011;
  error_code eVar2;
  int value;
  
  value = (int)CONCAT71(in_register_00000011,v);
  if (opt == reuse_address) {
    __fd = basic_io_device::native(&this->super_basic_io_device);
    iVar1 = 1;
    __optname = 2;
  }
  else if (opt == keep_alive) {
    __fd = basic_io_device::native(&this->super_basic_io_device);
    iVar1 = 1;
    __optname = 9;
  }
  else {
    if (opt != tcp_no_delay) {
      return;
    }
    __fd = basic_io_device::native(&this->super_basic_io_device);
    iVar1 = 6;
    __optname = 1;
  }
  iVar1 = setsockopt(__fd,iVar1,__optname,&value,4);
  if (iVar1 < 0) {
    eVar2 = socket_details::geterror();
    e->_M_value = eVar2._M_value;
    e->_M_cat = eVar2._M_cat;
  }
  return;
}

Assistant:

void basic_socket::set_option(boolean_option_type opt,bool v,system::error_code &e)
{
	int value = v ? 1 : 0;
	char const *p=reinterpret_cast<char const *>(&value);
	int res = 0;
	switch(opt) {
	case tcp_no_delay:
		res=::setsockopt(native(),IPPROTO_TCP,TCP_NODELAY,p,sizeof(value));
		break;
	case keep_alive:
		res=::setsockopt(native(),SOL_SOCKET,SO_KEEPALIVE,p,sizeof(value));
		break;
	case reuse_address:
		res=::setsockopt(native(),SOL_SOCKET,SO_REUSEADDR,p,sizeof(value));
		break;
	default:
		;
	}
	if(res < 0)
		e=geterror();
}